

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O3

t_pvalue __thiscall
xemmai::t_enum_of<std::filesystem::perms,_xemmai::t_os>::f_transfer
          (t_enum_of<std::filesystem::perms,_xemmai::t_os> *this,t_os *a_library,perms a_value)

{
  t_heap<xemmai::t_object> *this_00;
  t_type *ptVar1;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  undefined1 auVar2 [16];
  long *plVar3;
  t_object *ptVar4;
  undefined8 *puVar5;
  t_object *ptVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar10;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  size_t sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  t_pvalue tVar15;
  
  ptVar1 = (a_library->v_type_permissions).v_p;
  plVar3 = (long *)__tls_get_addr(&PTR_0011ed28);
  lVar7 = *plVar3;
  this_00 = (t_heap<xemmai::t_object> *)(lVar7 + 0x30);
  sVar11 = ptVar1->v_instance_fields * 0x10 + 0x50;
  if (sVar11 < 0x81) {
    plVar3 = (long *)__tls_get_addr(&PTR_0011ede0);
    ptVar6 = (t_object *)*plVar3;
    if (ptVar6 == (t_object *)0x0) {
      ptVar6 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(lVar7 + 0x90),this_00);
      ptVar4 = ptVar6->v_next;
    }
    else {
      ptVar4 = ptVar6->v_next;
    }
    *plVar3 = (long)ptVar4;
  }
  else {
    ptVar6 = t_heap<xemmai::t_object>::f_allocate_medium(this_00,sVar11);
  }
  ptVar6->v_next = (t_object *)0x0;
  auVar2 = _DAT_00118010;
  auVar14 = _DAT_00118000;
  sVar11 = ptVar1->v_instance_fields;
  if (sVar11 != 0) {
    lVar7 = sVar11 - 1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    pcVar8 = ptVar6->v_data + 0x18;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_00118010;
    do {
      auVar13._8_4_ = (int)uVar9;
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar13 | auVar14) ^ auVar2;
      if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                  auVar12._4_4_ < auVar13._4_4_) & 1)) {
        pcVar8[-0x10] = '\0';
        pcVar8[-0xf] = '\0';
        pcVar8[-0xe] = '\0';
        pcVar8[-0xd] = '\0';
        pcVar8[-0xc] = '\0';
        pcVar8[-0xb] = '\0';
        pcVar8[-10] = '\0';
        pcVar8[-9] = '\0';
      }
      if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
          auVar13._12_4_ <= auVar12._12_4_) {
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
      }
      uVar9 = uVar9 + 2;
      pcVar8 = pcVar8 + 0x20;
    } while ((sVar11 + 1 & 0xfffffffffffffffe) != uVar9);
  }
  *(ulong *)ptVar6->v_data = (ulong)a_value;
  puVar5 = (undefined8 *)__tls_get_addr(&PTR_0011ed00);
  this_01 = (t_queue<128UL> *)*puVar5;
  *this_01->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<128UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar6->v_type = ptVar1;
  auVar14 = __tls_get_addr(&PTR_0011ed50);
  aVar10.v_integer = auVar14._8_8_;
  this_02 = (t_queue<256UL> *)*auVar14._0_8_;
  *this_02->v_head = ptVar6;
  if (this_02->v_head == this_02->v_next) {
    t_slot::t_queue<256UL>::f_next(this_02);
    aVar10 = extraout_RDX;
  }
  else {
    this_02->v_head = this_02->v_head + 1;
  }
  *(t_object **)
   &(this->
    super_t_derivable<xemmai::t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>,_xemmai::t_derived<xemmai::t_type_of<std::filesystem::perms>_>_>
    ).super_t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>.
    super_t_derives<std::filesystem::perms,_xemmai::t_type_of<long>_>.super_t_type_of<long>.
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    .super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_> = ptVar6;
  tVar15.field_0.v_integer = aVar10.v_integer;
  tVar15.super_t_pointer.v_p = (t_object *)this;
  return tVar15;
}

Assistant:

static t_pvalue f_transfer(const T_library* a_library, T a_value)
	{
		return a_library->template f_type<typename t_fundamental<T>::t_type>()->template f_new<intptr_t>(static_cast<intptr_t>(a_value));
	}